

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

void Saig_TsiStatePrint(Saig_Tsim_t *p,uint *pState)

{
  if (0 < p->pAig->nRegs) {
    (*(code *)(&DAT_0091ffb0 +
              *(int *)(&DAT_0091ffb0 +
                      (ulong)((uint)((*pState & 1) != 0) + (*pState >> 1 & 1) * 2) * 4)))();
    return;
  }
  printf(" (0=%5d, 1=%5d, x=%5d)\n",0,0,0);
  return;
}

Assistant:

void Saig_TsiStatePrint( Saig_Tsim_t * p, unsigned * pState )
{
    int i, Value, nZeros = 0, nOnes = 0, nDcs = 0;
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        if ( Value == SAIG_XVS0 )
            printf( "0" ), nZeros++;
        else if ( Value == SAIG_XVS1 )
            printf( "1" ), nOnes++;
        else if ( Value == SAIG_XVSX )
            printf( "x" ), nDcs++;
        else
            assert( 0 );
    }
    printf( " (0=%5d, 1=%5d, x=%5d)\n", nZeros, nOnes, nDcs );
}